

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

parser_error parse_ego_brand(parser *p)

{
  byte bVar1;
  parser_error pVar2;
  void *pvVar3;
  char *__haystack;
  char *pcVar4;
  void *pvVar5;
  ulong uVar6;
  brand_conflict *pbVar7;
  
  pvVar3 = parser_priv(p);
  __haystack = parser_getstr(p,"code");
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    bVar1 = z_info->brand_max;
    uVar6 = 1;
    if (bVar1 < 2) {
LAB_0019e59c:
      pVar2 = PARSE_ERROR_UNRECOGNISED_BRAND;
      if ((uint)uVar6 != (uint)bVar1) {
        pvVar5 = *(void **)((long)pvVar3 + 0x1d8);
        if (pvVar5 == (void *)0x0) {
          pvVar5 = mem_zalloc((ulong)bVar1);
          *(void **)((long)pvVar3 + 0x1d8) = pvVar5;
        }
        *(undefined1 *)((long)pvVar5 + (uVar6 & 0xffffffff)) = 1;
        pVar2 = PARSE_ERROR_NONE;
      }
    }
    else {
      uVar6 = 1;
      pbVar7 = brands;
      do {
        pbVar7 = pbVar7 + 1;
        pcVar4 = strstr(__haystack,pbVar7->code);
        if (pcVar4 != (char *)0x0) goto LAB_0019e59c;
        uVar6 = uVar6 + 1;
      } while ((uint)bVar1 != uVar6);
      pVar2 = PARSE_ERROR_UNRECOGNISED_BRAND;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_ego_brand(struct parser *p) {
	struct ego_item *e = parser_priv(p);
	const char *s = parser_getstr(p, "code");
	int i;

	if (!e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	for (i = 1; i < z_info->brand_max; i++) {
		if (strstr(s, brands[i].code)) break;
	}
	if (i == z_info->brand_max) {
		return PARSE_ERROR_UNRECOGNISED_BRAND;
	}
	if (!e->brands) {
		e->brands = mem_zalloc(z_info->brand_max * sizeof(bool));
	}
	e->brands[i] = true;
	return PARSE_ERROR_NONE;
}